

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O3

int sam_hdr_update_hashes(SAM_hdr *sh,int type,SAM_hdr_type *h_type)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  kh_cstr_t pcVar4;
  kh_m_s2i_t *pkVar5;
  khint32_t *pkVar6;
  char cVar7;
  uint32_t uVar8;
  khint_t kVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  SAM_SQ *pSVar13;
  char *pcVar14;
  SAM_RG *pSVar15;
  size_t sVar16;
  SAM_PG *pSVar17;
  ulong uVar18;
  int *piVar19;
  byte bVar20;
  uint uVar21;
  SAM_hdr_tag_s *pSVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  uint uVar26;
  int i;
  long lVar27;
  int r_2;
  int r_1;
  int r;
  int local_3c;
  int local_38;
  int local_34;
  
  iVar23 = type >> 8;
  if ((type & 0xffU) == 0x51 && iVar23 == 0x53) {
    iVar24 = sh->nref;
    lVar25 = (long)iVar24;
    pSVar13 = (SAM_SQ *)realloc(sh->ref,lVar25 * 0x20 + 0x20);
    sh->ref = pSVar13;
    if (pSVar13 == (SAM_SQ *)0x0) {
      return -1;
    }
    pSVar22 = h_type->tag;
    pSVar13[lVar25].name = (char *)0x0;
    pSVar13[lVar25].len = 0;
    pSVar13[lVar25].ty = h_type;
    pSVar13[lVar25].tag = pSVar22;
    if (pSVar22 != (SAM_hdr_tag *)0x0) {
      do {
        pcVar3 = pSVar22->str;
        if (*pcVar3 == 'L') {
          if (pcVar3[1] == 'N') {
            uVar8 = atoi(pcVar3 + 3);
            sh->ref[lVar25].len = uVar8;
          }
        }
        else if ((*pcVar3 == 'S') && (pcVar3[1] == 'N')) {
          iVar11 = pSVar22->len;
          pcVar14 = (char *)malloc((long)iVar11);
          pSVar13 = sh->ref;
          pSVar13[lVar25].name = pcVar14;
          if (pcVar14 == (char *)0x0) {
            return -1;
          }
          strncpy(pcVar14,pcVar3 + 3,(long)iVar11 - 3);
          pSVar13[lVar25].name[(long)pSVar22->len + -3] = '\0';
        }
        pSVar22 = pSVar22->next;
      } while (pSVar22 != (SAM_hdr_tag_s *)0x0);
      pcVar4 = sh->ref[lVar25].name;
      if (pcVar4 != (kh_cstr_t)0x0) {
        kVar9 = kh_put_m_s2i(sh->ref_hash,pcVar4,&local_34);
        if (local_34 == -1) {
          return -1;
        }
        sh->ref_hash->vals[kVar9] = iVar24;
      }
    }
    sh->nref = sh->nref + 1;
  }
  if (iVar23 == 0x52 && (type & 0xffU) == 0x47) {
    iVar24 = sh->nrg;
    lVar25 = (long)iVar24;
    pSVar15 = (SAM_RG *)realloc(sh->rg,lVar25 * 0x20 + 0x20);
    sh->rg = pSVar15;
    if (pSVar15 == (SAM_RG *)0x0) {
      return -1;
    }
    pSVar22 = h_type->tag;
    pSVar15[lVar25].name = (char *)0x0;
    pSVar15[lVar25].name_len = 0;
    pSVar15[lVar25].ty = h_type;
    pSVar15[lVar25].tag = pSVar22;
    pSVar15[lVar25].id = iVar24;
    if (pSVar22 == (SAM_hdr_tag *)0x0) {
LAB_00133138:
      sh->nrg = sh->nrg + 1;
      goto LAB_00133147;
    }
    do {
      pcVar3 = pSVar22->str;
      if ((*pcVar3 == 'I') && (pcVar3[1] == 'D')) {
        iVar11 = pSVar22->len;
        pcVar14 = (char *)malloc((long)iVar11);
        pSVar15[lVar25].name = pcVar14;
        if (pcVar14 == (char *)0x0) goto LAB_00133471;
        strncpy(pcVar14,pcVar3 + 3,(long)iVar11 - 3);
        pSVar15[lVar25].name[(long)pSVar22->len + -3] = '\0';
        pSVar15 = sh->rg;
        sVar16 = strlen(pSVar15[lVar25].name);
        pSVar15[lVar25].name_len = (int)sVar16;
      }
      pSVar22 = pSVar22->next;
    } while (pSVar22 != (SAM_hdr_tag_s *)0x0);
    if (pSVar15[lVar25].name == (kh_cstr_t)0x0) goto LAB_00133138;
    kVar9 = kh_put_m_s2i(sh->rg_hash,pSVar15[lVar25].name,&local_38);
    if (local_38 != -1) {
      sh->rg_hash->vals[kVar9] = iVar24;
      goto LAB_00133138;
    }
LAB_00133471:
    iVar23 = -1;
  }
  else {
LAB_00133147:
    if (iVar23 != 0x50 || (type & 0xffU) != 0x47) {
      return 0;
    }
    iVar23 = sh->npg;
    lVar25 = (long)iVar23;
    pSVar17 = (SAM_PG *)realloc(sh->pg,lVar25 * 0x28 + 0x28);
    sh->pg = pSVar17;
    if (pSVar17 == (SAM_PG *)0x0) {
      return -1;
    }
    pSVar22 = h_type->tag;
    pSVar17[lVar25].name = (char *)0x0;
    pSVar17[lVar25].name_len = 0;
    pSVar17[lVar25].ty = h_type;
    pSVar17[lVar25].tag = pSVar22;
    pSVar17[lVar25].id = iVar23;
    pSVar17[lVar25].prev_id = -1;
    if (pSVar22 != (SAM_hdr_tag *)0x0) {
      do {
        pcVar3 = pSVar22->str;
        if (*pcVar3 == 'P') {
          if (pcVar3[1] == 'P') {
            cVar1 = pcVar3[pSVar22->len];
            pcVar3[pSVar22->len] = '\0';
            pkVar5 = sh->pg_hash;
            pcVar3 = pSVar22->str;
            uVar12 = pkVar5->n_buckets;
            if (uVar12 == 0) {
              uVar12 = 0;
            }
            else {
              cVar7 = pcVar3[3];
              uVar21 = (uint)cVar7;
              if (cVar7 == '\0') {
                uVar21 = 0;
              }
              else {
                cVar7 = pcVar3[4];
                if (cVar7 != '\0') {
                  pcVar14 = pcVar3 + 5;
                  do {
                    uVar21 = (int)cVar7 + uVar21 * 0x1f;
                    cVar7 = *pcVar14;
                    pcVar14 = pcVar14 + 1;
                  } while (cVar7 != '\0');
                }
              }
              uVar21 = uVar21 & uVar12 - 1;
              pkVar6 = pkVar5->flags;
              iVar24 = 1;
              uVar26 = uVar21;
              do {
                uVar2 = pkVar6[uVar26 >> 4];
                bVar20 = (char)uVar26 * '\x02' & 0x1e;
                uVar10 = uVar2 >> bVar20;
                if (((uVar10 & 2) != 0) ||
                   (((uVar10 & 1) == 0 &&
                    (iVar11 = strcmp(pkVar5->keys[uVar26],pcVar3 + 3), iVar11 == 0)))) {
                  if ((uVar2 >> bVar20 & 3) == 0) {
                    uVar12 = uVar26;
                  }
                  break;
                }
                uVar26 = uVar26 + iVar24 & uVar12 - 1;
                iVar24 = iVar24 + 1;
              } while (uVar26 != uVar21);
            }
            pcVar3[pSVar22->len] = cVar1;
            if (uVar12 == sh->pg_hash->n_buckets) {
              sh->pg[lVar25].prev_id = -1;
            }
            else {
              iVar24 = sh->pg_hash->vals[uVar12];
              sh->pg[lVar25].prev_id = sh->pg[iVar24].id;
              uVar18 = (ulong)sh->npg_end;
              if (0 < (long)uVar18) {
                if (sh->pg_end[uVar18 - 1] == iVar24) {
                  sh->npg_end = sh->npg_end + -1;
                }
                else {
                  iVar11 = -1;
                  lVar27 = 0;
                  do {
                    piVar19 = sh->pg_end;
                    if (piVar19[lVar27] == iVar24) {
                      memmove(piVar19 + lVar27,piVar19 + lVar27 + 1,
                              (long)((int)uVar18 + iVar11) << 2);
                      uVar12 = sh->npg_end - 1;
                      uVar18 = (ulong)uVar12;
                      sh->npg_end = uVar12;
                    }
                    lVar27 = lVar27 + 1;
                    iVar11 = iVar11 + -1;
                  } while (lVar27 < (int)uVar18);
                }
              }
            }
          }
        }
        else if ((*pcVar3 == 'I') && (pcVar3[1] == 'D')) {
          iVar24 = pSVar22->len;
          pcVar14 = (char *)malloc((long)iVar24);
          pSVar17 = sh->pg;
          pSVar17[lVar25].name = pcVar14;
          if (pcVar14 == (char *)0x0) goto LAB_00133471;
          strncpy(pcVar14,pcVar3 + 3,(long)iVar24 - 3);
          pSVar17[lVar25].name[(long)pSVar22->len + -3] = '\0';
          pSVar17 = sh->pg;
          sVar16 = strlen(pSVar17[lVar25].name);
          pSVar17[lVar25].name_len = (int)sVar16;
        }
        pSVar22 = pSVar22->next;
      } while (pSVar22 != (SAM_hdr_tag_s *)0x0);
      pcVar4 = sh->pg[lVar25].name;
      if (pcVar4 != (kh_cstr_t)0x0) {
        kVar9 = kh_put_m_s2i(sh->pg_hash,pcVar4,&local_3c);
        if (local_3c == -1) goto LAB_00133471;
        sh->pg_hash->vals[kVar9] = iVar23;
      }
    }
    iVar24 = sh->npg_end;
    iVar11 = sh->npg_end_alloc;
    if (iVar24 < iVar11) {
      piVar19 = sh->pg_end;
    }
    else {
      iVar24 = 4;
      if (iVar11 != 0) {
        iVar24 = iVar11 * 2;
      }
      sh->npg_end_alloc = iVar24;
      piVar19 = (int *)realloc(sh->pg_end,(long)iVar24 << 2);
      sh->pg_end = piVar19;
      if (piVar19 == (int *)0x0) {
        return -1;
      }
      iVar24 = sh->npg_end;
    }
    sh->npg_end = iVar24 + 1;
    piVar19[iVar24] = iVar23;
    sh->npg = sh->npg + 1;
    iVar23 = 0;
  }
  return iVar23;
}

Assistant:

static int sam_hdr_update_hashes(SAM_hdr *sh,
				 int type,
				 SAM_hdr_type *h_type) {
    /* Add to reference hash? */
    if ((type>>8) == 'S' && (type&0xff) == 'Q') {
	SAM_hdr_tag *tag;
	int nref = sh->nref;

	sh->ref = realloc(sh->ref, (sh->nref+1)*sizeof(*sh->ref));
	if (!sh->ref)
	    return -1;

	tag = h_type->tag;
	sh->ref[nref].name = NULL;
	sh->ref[nref].len  = 0;
	sh->ref[nref].ty = h_type;
	sh->ref[nref].tag  = tag;

	while (tag) {
	    if (tag->str[0] == 'S' && tag->str[1] == 'N') {
		if (!(sh->ref[nref].name = malloc(tag->len)))
		    return -1;
		strncpy(sh->ref[nref].name, tag->str+3, tag->len-3);
		sh->ref[nref].name[tag->len-3] = 0;
	    } else if (tag->str[0] == 'L' && tag->str[1] == 'N') {
		sh->ref[nref].len = atoi(tag->str+3);
	    }
	    tag = tag->next;
	}

	if (sh->ref[nref].name) {
	    khint_t k;
	    int r;
	    k = kh_put(m_s2i, sh->ref_hash, sh->ref[nref].name, &r);
	    if (-1 == r) return -1;
	    kh_val(sh->ref_hash, k) = nref;
	}

	sh->nref++;
    }

    /* Add to read-group hash? */
    if ((type>>8) == 'R' && (type&0xff) == 'G') {
	SAM_hdr_tag *tag;
	int nrg = sh->nrg;

	sh->rg = realloc(sh->rg, (sh->nrg+1)*sizeof(*sh->rg));
	if (!sh->rg)
	    return -1;

	tag = h_type->tag;
	sh->rg[nrg].name = NULL;
	sh->rg[nrg].name_len = 0;
	sh->rg[nrg].ty   = h_type;
	sh->rg[nrg].tag  = tag;
	sh->rg[nrg].id   = nrg;

	while (tag) {
	    if (tag->str[0] == 'I' && tag->str[1] == 'D') {
		if (!(sh->rg[nrg].name = malloc(tag->len)))
		    return -1;
		strncpy(sh->rg[nrg].name, tag->str+3, tag->len-3);
		sh->rg[nrg].name[tag->len-3] = 0;
		sh->rg[nrg].name_len = strlen(sh->rg[nrg].name);
	    }
	    tag = tag->next;
	}

	if (sh->rg[nrg].name) {
	    khint_t k;
	    int r;
	    k = kh_put(m_s2i, sh->rg_hash, sh->rg[nrg].name, &r);
	    if (-1 == r) return -1;
	    kh_val(sh->rg_hash, k) = nrg;
	}

	sh->nrg++;
    }

    /* Add to program hash? */
    if ((type>>8) == 'P' && (type&0xff) == 'G') {
	SAM_hdr_tag *tag;
	int npg = sh->npg;

	sh->pg = realloc(sh->pg, (sh->npg+1)*sizeof(*sh->pg));
	if (!sh->pg)
	    return -1;

	tag = h_type->tag;
	sh->pg[npg].name = NULL;
	sh->pg[npg].name_len = 0;
	sh->pg[npg].ty  = h_type;
	sh->pg[npg].tag  = tag;
	sh->pg[npg].id   = npg;
	sh->pg[npg].prev_id = -1;

	while (tag) {
	    if (tag->str[0] == 'I' && tag->str[1] == 'D') {
		if (!(sh->pg[npg].name = malloc(tag->len)))
		    return -1;
		strncpy(sh->pg[npg].name, tag->str+3, tag->len-3);
		sh->pg[npg].name[tag->len-3] = 0;
		sh->pg[npg].name_len = strlen(sh->pg[npg].name);
	    } else if (tag->str[0] == 'P' && tag->str[1] == 'P') {
		// Resolve later if needed
		khint_t k;
		char tmp = tag->str[tag->len]; tag->str[tag->len] = 0;
		k = kh_get(m_s2i, sh->pg_hash, tag->str+3);
		tag->str[tag->len] = tmp;

		if (k != kh_end(sh->pg_hash)) {
		    int p_id = kh_val(sh->pg_hash, k);
		    sh->pg[npg].prev_id = sh->pg[p_id].id;

		    /* Unmark previous entry as a PG termination */
		    if (sh->npg_end > 0 &&
			sh->pg_end[sh->npg_end-1] == p_id) {
			sh->npg_end--;
		    } else {
			int i;
			for (i = 0; i < sh->npg_end; i++) {
			    if (sh->pg_end[i] == p_id) {
				memmove(&sh->pg_end[i], &sh->pg_end[i+1],
					(sh->npg_end-i-1)*sizeof(*sh->pg_end));
				sh->npg_end--;
			    }
			}
		    }
		} else {
		    sh->pg[npg].prev_id = -1;
		}
	    }
	    tag = tag->next;
	}

	if (sh->pg[npg].name) {
	    khint_t k;
	    int r;
	    k = kh_put(m_s2i, sh->pg_hash, sh->pg[npg].name, &r);
	    if (-1 == r) return -1;
	    kh_val(sh->pg_hash, k) = npg;
	}

	/* Add to npg_end[] array. Remove later if we find a PP line */
	if (sh->npg_end >= sh->npg_end_alloc) {
	    sh->npg_end_alloc = sh->npg_end_alloc
		? sh->npg_end_alloc*2
		: 4;
	    sh->pg_end = realloc(sh->pg_end,
				 sh->npg_end_alloc * sizeof(int));
	    if (!sh->pg_end)
		return -1;
	}
	sh->pg_end[sh->npg_end++] = npg;

	sh->npg++;
    }

    return 0;
}